

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O3

void __thiscall VariableEffect::reset(VariableEffect *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_mapVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_mapVariables)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    *(undefined8 *)(*(long *)(p_Var1 + 2) + 0x10) = *(undefined8 *)(*(long *)(p_Var1 + 2) + 8);
  }
  (*this->_pfApplyVariables)(&this->_mapVariables,this->_pEffect);
  return;
}

Assistant:

void reset()
	{
		MapVariables::iterator iterVars;
		for(iterVars = _mapVariables.begin(); iterVars != _mapVariables.end(); iterVars++)
			iterVars->second->reset();
		_pfApplyVariables(_mapVariables, _pEffect);
	}